

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorts.cpp
# Opt level: O2

int main(void)

{
  pointer pEVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  result_type rVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  Edge *i;
  pointer pEVar10;
  long lVar11;
  pointer pEVar12;
  allocator_type local_1419;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> v2;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> v1;
  default_random_engine e1;
  uniform_int_distribution<unsigned_long> uniform_dist;
  random_device r;
  
  std::random_device::random_device(&r);
  uVar3 = std::random_device::_M_getval();
  iVar9 = (int)((uVar3 & 0xffffffff) % 0x7fffffff);
  e1._M_x = (unsigned_long)(iVar9 + (uint)(iVar9 == 0));
  uniform_dist._M_param._M_a = 0;
  uniform_dist._M_param._M_b = 0xffffffffffffffff;
  uVar3 = 1;
  while( true ) {
    if (10000 < uVar3) {
      std::random_device::~random_device(&r);
      return 0;
    }
    v2.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    v2.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    v2.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._0_1_ = 0;
    std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
              ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)
               &v1.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>,uVar3 * 10000,
               (value_type *)&v2,&local_1419);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar4);
    pEVar1 = v1.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pEVar10 = v1.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                   super__Vector_impl_data._M_start; pEVar10 != pEVar1; pEVar10 = pEVar10 + 1) {
      rVar5 = std::uniform_int_distribution<unsigned_long>::operator()(&uniform_dist,&e1);
      pEVar10->shift = rVar5;
    }
    std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
              (&v2,(vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)
                   &v1.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>);
    lVar6 = std::chrono::_V2::system_clock::now();
    srs::radixSort((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)
                   &v1.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>);
    lVar7 = std::chrono::_V2::system_clock::now();
    std::operator<<((ostream *)&std::cout,"Radix sort: ");
    poVar4 = std::ostream::_M_insert<double>((double)(lVar7 - lVar6) / 1000000000.0);
    poVar4 = std::operator<<(poVar4," sec.");
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar6 = std::chrono::_V2::system_clock::now();
    pEVar10 = v2.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pEVar1 = v2.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (v2.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
        super__Vector_impl_data._M_start !=
        v2.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar11 = (long)v2.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)v2.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar8 = lVar11 >> 5;
      lVar7 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Graph::Edge*,std::vector<Graph::Edge,std::allocator<Graph::Edge>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (v2.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 v2.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar11 < 0x201) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Graph::Edge*,std::vector<Graph::Edge,std::allocator<Graph::Edge>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (pEVar1,pEVar10);
      }
      else {
        pEVar12 = pEVar1 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Graph::Edge*,std::vector<Graph::Edge,std::allocator<Graph::Edge>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (pEVar1,pEVar12);
        for (; pEVar12 != pEVar10; pEVar12 = pEVar12 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Graph::Edge*,std::vector<Graph::Edge,std::allocator<Graph::Edge>>>,__gnu_cxx::__ops::_Val_comp_iter<main::__0>>
                    (pEVar12);
        }
      }
    }
    lVar7 = std::chrono::_V2::system_clock::now();
    std::operator<<((ostream *)&std::cout,"std::sort: ");
    poVar4 = std::ostream::_M_insert<double>((double)(lVar7 - lVar6) / 1000000000.0);
    poVar4 = std::operator<<(poVar4," sec.");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar2 = std::operator==((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)
                            &v1.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>,&v2);
    if (!bVar2) break;
    std::_Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>::~_Vector_base
              (&v2.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>);
    std::_Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>::~_Vector_base
              (&v1.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>);
    uVar3 = uVar3 * 10;
  }
  __assert_fail("v1 == v2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rogday[P]SRS/src/tests/sorts.cpp"
                ,0x2c,"int main()");
}

Assistant:

int main() {
    std::random_device r;
    std::default_random_engine e1(r());
    std::uniform_int_distribution<srs::u64> uniform_dist(
        0, std::numeric_limits<srs::u64>::max());

    for (std::uint64_t i = 1; i <= 10'000; i *= 10) {
        std::vector<Graph::Edge> v1(10'000 * i, Graph::Edge(0, 0, false, 0));

        std::cout << v1.size() << std::endl;
        for (auto &i : v1)
            i.shift = uniform_dist(e1);
        std::vector v2(v1);

        auto start = std::chrono::system_clock::now();
        srs::radixSort(v1);
        auto end = std::chrono::system_clock::now();

        std::cout << "Radix sort: "
                  << std::chrono::duration<double>(end - start).count()
                  << " sec." << std::endl;

        start = std::chrono::system_clock::now();
        std::sort(std::begin(v2), std::end(v2),
                  [](const Graph::Edge &e1, const Graph::Edge &e2) {
                      return e1.shift < e2.shift;
                  });
        end = std::chrono::system_clock::now();

        std::cout << "std::sort: "
                  << std::chrono::duration<double>(end - start).count()
                  << " sec." << std::endl
                  << std::endl;

        assert(v1 == v2);
    }
}